

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripser.cc
# Opt level: O1

Euclidean_distance_matrix *
read_point_cloud(Euclidean_distance_matrix *__return_storage_ptr__,istream *input_stream)

{
  pointer pvVar1;
  pointer pvVar2;
  Euclidean_distance_matrix *pEVar3;
  char cVar4;
  istream *piVar5;
  ostream *poVar6;
  vector<float,_std::allocator<float>_> point;
  value_t value;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  points;
  Euclidean_distance_matrix *eucl_dist;
  string line;
  istringstream s;
  value_type local_218;
  float local_1fc;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  local_1f8;
  Euclidean_distance_matrix *local_1d8;
  undefined1 *local_1d0;
  undefined8 local_1c8;
  undefined1 local_1c0;
  undefined7 uStack_1bf;
  istringstream local_1b0 [120];
  ios_base local_138 [264];
  
  local_1f8.
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1f8.
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1f8.
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1d0 = &local_1c0;
  local_1c8 = 0;
  local_1c0 = 0;
  local_1d8 = __return_storage_ptr__;
  while( true ) {
    cVar4 = std::ios::widen((char)*(undefined8 *)(*(long *)input_stream + -0x18) +
                            (char)input_stream);
    piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       (input_stream,(string *)&local_1d0,cVar4);
    pEVar3 = local_1d8;
    if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) {
      Gudhi::ripser::Euclidean_distance_matrix<Params>::Euclidean_distance_matrix
                (local_1d8,&local_1f8);
      pvVar1 = (pEVar3->points).
               super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pvVar2 = (pEVar3->points).
               super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"point cloud with ",0x11);
      poVar6 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)&std::cout,
                          (int)((ulong)((long)pvVar2 - (long)pvVar1) >> 3) * -0x55555555);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," points in dimension ",0x15);
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
      if (local_1d0 != &local_1c0) {
        operator_delete(local_1d0,CONCAT71(uStack_1bf,local_1c0) + 1);
      }
      std::
      vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ::~vector(&local_1f8);
      return pEVar3;
    }
    local_218.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (float *)0x0;
    local_218.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (float *)0x0;
    local_218.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (float *)0x0;
    std::__cxx11::istringstream::istringstream(local_1b0,(string *)&local_1d0,_S_in);
    while( true ) {
      piVar5 = std::istream::_M_extract<float>((float *)local_1b0);
      if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) break;
      if (local_218.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_218.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                  ((vector<float,std::allocator<float>> *)&local_218,
                   (iterator)
                   local_218.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_1fc);
      }
      else {
        *local_218.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
         ._M_finish = local_1fc;
        local_218.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_218.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      std::istream::ignore();
    }
    if (local_218.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        local_218.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      std::
      vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ::push_back(&local_1f8,&local_218);
    }
    if ((long)local_218.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_218.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start !=
        (long)((local_1f8.
                super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->
              super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
              _M_finish -
        (long)((local_1f8.
                super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->
              super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
              _M_start) break;
    std::__cxx11::istringstream::~istringstream(local_1b0);
    std::ios_base::~ios_base(local_138);
    if (local_218.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start != (float *)0x0) {
      operator_delete(local_218.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_218.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_218.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  __assert_fail("point.size() == points.front().size()",
                "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Ripser/utilities/ripser.cc"
                ,0x6a,"Euclidean_distance_matrix read_point_cloud(std::istream &)");
}

Assistant:

Euclidean_distance_matrix read_point_cloud(std::istream& input_stream) {
  std::vector<std::vector<value_t>> points;

  std::string line;
  value_t value;
  while (std::getline(input_stream, line)) {
    std::vector<value_t> point;
    std::istringstream s(line);
    while (s >> value) {
      point.push_back(value);
      s.ignore();
    }
    if (!point.empty()) points.push_back(point);
    assert(point.size() == points.front().size());
  }

  std::size_t d = points.front().size();
  Euclidean_distance_matrix eucl_dist(std::move(points));
  vertex_t n = eucl_dist.size();
  std::cout << "point cloud with " << n << " points in dimension "
    << d << std::endl;

  return eucl_dist;
}